

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O2

void coll_tmap_balance_remove(coll_tmap_t *map,entry_t_conflict *entry)

{
  coll_tmap_entry_t *pcVar1;
  coll_tmap_entry_t *entry_00;
  entry_t_conflict *entry_01;
  entry_t_conflict *peVar2;
  coll_tmap_entry_t *pcVar3;
  
LAB_001059d4:
  do {
    do {
      do {
        peVar2 = entry;
        if (peVar2 == map->root) {
          if (peVar2 != (entry_t_conflict *)0x0) {
LAB_00105bf6:
            peVar2->color = '\0';
          }
          return;
        }
        entry = (entry_t_conflict *)0x0;
      } while (peVar2 == (entry_t_conflict *)0x0);
      if (peVar2->color != '\0') goto LAB_00105bf6;
      entry_01 = peVar2->parent;
      entry = (entry_t_conflict *)0x0;
    } while (entry_01 == (entry_t_conflict *)0x0);
    entry = entry_01;
    if (peVar2 == entry_01->left) {
      entry_00 = entry_01->right;
      if (entry_00 != (coll_tmap_entry_t *)0x0) {
        if (entry_00->color == '\x01') {
          entry_00->color = '\0';
          entry_01->color = '\x01';
          entry_rotate_left(map,entry_01);
          entry_01 = peVar2->parent;
          entry = (entry_t_conflict *)0x0;
          if ((entry_01 == (coll_tmap_entry_t *)0x0) ||
             (entry_00 = entry_01->right, entry = entry_01, entry_00 == (coll_tmap_entry_t *)0x0))
          goto LAB_001059d4;
        }
        pcVar3 = entry_00->left;
        if ((pcVar3 == (coll_tmap_entry_t *)0x0) || (pcVar3->color == '\0')) {
          pcVar1 = entry_00->right;
          if ((pcVar1 == (coll_tmap_entry_t *)0x0) || (pcVar1->color == '\0')) {
LAB_00105bbb:
            entry_00->color = '\x01';
            entry = entry_01;
            goto LAB_001059d4;
          }
          if (pcVar1->color == '\0') {
            if (pcVar3 != (coll_tmap_entry_t *)0x0) goto LAB_00105b77;
            goto LAB_00105b7b;
          }
LAB_00105b9f:
          entry_00->color = entry_01->color;
          entry_01->color = '\0';
          pcVar3 = entry_00->right;
          if (pcVar3 != (coll_tmap_entry_t *)0x0) {
LAB_00105bb5:
            pcVar3->color = '\0';
          }
        }
        else {
          if ((entry_00->right != (coll_tmap_entry_t *)0x0) && (entry_00->right->color != '\0'))
          goto LAB_00105b9f;
LAB_00105b77:
          pcVar3->color = '\0';
LAB_00105b7b:
          entry_00->color = '\x01';
          entry_rotate_right(map,entry_00);
          entry_01 = peVar2->parent;
          if (entry_01 != (coll_tmap_entry_t *)0x0) {
            entry_00 = entry_01->right;
            pcVar3 = entry_01;
            if (entry_00 != (coll_tmap_entry_t *)0x0) goto LAB_00105b9f;
            goto LAB_00105bb5;
          }
          entry_01 = (entry_t_conflict *)0x0;
        }
        entry_rotate_left(map,entry_01);
        entry = map->root;
      }
      goto LAB_001059d4;
    }
    entry_00 = entry_01->left;
  } while (entry_00 == (coll_tmap_entry_t *)0x0);
  if (entry_00->color == '\x01') {
    entry_00->color = '\0';
    entry_01->color = '\x01';
    entry_rotate_right(map,entry_01);
    entry_01 = peVar2->parent;
    entry = (entry_t_conflict *)0x0;
    if ((entry_01 == (coll_tmap_entry_t *)0x0) ||
       (entry_00 = entry_01->left, entry = entry_01, entry_00 == (coll_tmap_entry_t *)0x0))
    goto LAB_001059d4;
  }
  pcVar3 = entry_00->right;
  if ((pcVar3 == (coll_tmap_entry_t *)0x0) || (pcVar3->color == '\0')) {
    pcVar1 = entry_00->left;
    if ((pcVar1 == (coll_tmap_entry_t *)0x0) || (pcVar1->color == '\0')) goto LAB_00105bbb;
    if (pcVar1->color == '\0') {
      if (pcVar3 != (coll_tmap_entry_t *)0x0) goto LAB_00105b15;
      goto LAB_00105b19;
    }
LAB_00105b41:
    entry_00->color = entry_01->color;
    entry_01->color = '\0';
    peVar2 = entry_00->left;
    if (peVar2 != (entry_t_conflict *)0x0) {
LAB_00105b57:
      peVar2->color = '\0';
    }
  }
  else {
    if ((entry_00->left != (coll_tmap_entry_t *)0x0) && (entry_00->left->color != '\0'))
    goto LAB_00105b41;
LAB_00105b15:
    pcVar3->color = '\0';
LAB_00105b19:
    entry_00->color = '\x01';
    entry_rotate_left(map,entry_00);
    entry_01 = peVar2->parent;
    if (entry_01 != (entry_t_conflict *)0x0) {
      entry_00 = entry_01->left;
      peVar2 = entry_01;
      if (entry_00 != (coll_tmap_entry_t *)0x0) goto LAB_00105b41;
      goto LAB_00105b57;
    }
    entry_01 = (entry_t_conflict *)0x0;
  }
  entry_rotate_right(map,entry_01);
  entry = map->root;
  goto LAB_001059d4;
}

Assistant:

static void coll_tmap_balance_remove(coll_tmap_t *map, entry_t *entry) {
    while (entry != map->root && color(entry) == BLACK) {
        if (entry == left(parent(entry))) {
            entry_t *sib = right(parent(entry));  // sibling

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_left(map, parent(entry));
                sib = right(parent(entry));
            }

            if (color(left(sib)) == BLACK && color(right(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(right(sib)) == BLACK) {
                    dye(left(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_right(map, sib);
                    sib = right(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(right(sib), BLACK);
                entry_rotate_left(map, parent(entry));
                entry = map->root;
            }
        } else {
            entry_t *sib = left(parent(entry));

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_right(map, parent(entry));
                sib = left(parent(entry));
            }

            if (color(right(sib)) == BLACK && color(left(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(left(sib)) == BLACK) {
                    dye(right(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_left(map, sib);
                    sib = left(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(left(sib), BLACK);
                entry_rotate_right(map, parent(entry));
                entry = map->root;
            }
        }
    }
    dye(entry, BLACK);
}